

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

int __thiscall cmCTestBZR::LogParser::InitializeParser(LogParser *this)

{
  int iVar1;
  
  iVar1 = cmXMLParser::InitializeParser(&this->super_cmXMLParser);
  if (iVar1 != 0) {
    XML_SetUnknownEncodingHandler
              ((XML_Parser)(this->super_cmXMLParser).Parser,cmBZRXMLParserUnknownEncodingHandler,
               (void *)0x0);
  }
  return iVar1;
}

Assistant:

int InitializeParser() override
  {
    int res = this->cmXMLParser::InitializeParser();
    if (res) {
      XML_SetUnknownEncodingHandler(static_cast<XML_Parser>(this->Parser),
                                    cmBZRXMLParserUnknownEncodingHandler,
                                    nullptr);
    }
    return res;
  }